

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O2

void __thiscall MxxColl_ScattervGeneral_Test::TestBody(MxxColl_ScattervGeneral_Test *this)

{
  unsigned_long uVar1;
  int iVar2;
  int iVar3;
  char *message;
  long lVar4;
  long lVar5;
  bool bVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  AssertHelper local_b8;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  comm c;
  vector<int,_std::allocator<int>_> vec;
  
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&ompi_mpi_comm_world;
  mxx::comm::comm(&c,(MPI_Comm *)&vec);
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (c.m_rank == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&sizes,(long)c.m_size);
    lVar5 = 1;
    iVar2 = 0;
    uVar1 = 0;
    while ((long)uVar1 < (long)c.m_size) {
      sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] = uVar1 + 1;
      lVar4 = lVar5;
      iVar3 = iVar2;
      while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
        result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = iVar3;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&vec,(int *)&result);
        iVar3 = iVar3 + 2;
      }
      lVar5 = lVar5 + 1;
      iVar2 = iVar2 + 3;
      uVar1 = uVar1 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&result,(long)(c.m_rank + 1),(allocator_type *)&gtest_ar);
  iVar2 = 0;
  mxx::scatterv<int>(vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,&sizes,
                     (int *)CONCAT44(result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     (int)result.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start),
                     (long)c.m_rank + 1,0,&c);
  lVar5 = 0;
  lVar4 = 0;
  do {
    if ((int)((ulong)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     CONCAT44(result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start)) >> 2) <= lVar4) {
LAB_0010b7d9:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&result.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vec.super__Vector_base<int,_std::allocator<int>_>);
      mxx::comm::~comm(&c);
      return;
    }
    local_c0.ptr_._0_4_ = c.m_rank * 3 + iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"2*j+3*c.rank()","result[j]",(int *)&local_c0,
               (int *)(CONCAT44(result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) + lVar5));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_c0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                 ,0x93,message);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_c0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      goto LAB_0010b7d9;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar4 = lVar4 + 1;
    iVar2 = iVar2 + 2;
    lVar5 = lVar5 + 4;
  } while( true );
}

Assistant:

TEST(MxxColl, ScattervGeneral) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    std::vector<size_t> sizes;

    // scatter from 0
    if (c.rank() == 0) {
        sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            sizes[i] = i+1;
            for (size_t j = 0; j < (size_t)(i+1); ++j)
            {
                vec.push_back(2*j + 3*i);
            }
        }
    }

    // test general case
    std::vector<int> result(c.rank()+1);
    mxx::scatterv(&vec[0], sizes, &result.front(), c.rank()+1, 0, c);
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(2*j+3*c.rank(), result[j]);
    }
}